

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O0

void objclr(mcmcxdef *mctx,objnum objn,prpnum mindel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  mcmcxdef *mctx_00;
  long lVar8;
  ushort in_DX;
  ushort in_SI;
  undefined8 *in_RDI;
  objnum in_stack_0000000e;
  mcmcxdef *in_stack_00000010;
  int indexed;
  prpnum prop;
  int cnt;
  prpdef *p;
  objdef *o;
  mcmon in_stack_ffffffffffffff8e;
  mcmcxdef *in_stack_ffffffffffffff90;
  mcmcxdef *in_stack_ffffffffffffff98;
  undefined2 uVar9;
  int in_stack_ffffffffffffffd8;
  
  puVar6 = mcmlck(in_stack_ffffffffffffff98,(mcmon)((ulong)in_stack_ffffffffffffff90 >> 0x30));
  uVar1 = osrp2(puVar6 + 2);
  iVar2 = osrp2(puVar6 + 6);
  if ((short)iVar2 != 0) {
    uVar3 = osrp2(puVar6 + 4);
    uVar4 = osrp2(puVar6 + 8);
    uVar5 = osrp2(puVar6 + 4);
    memmove(puVar6 + 0xe,puVar6 + (long)(int)((uVar3 & 0xffff) << 1) + 0xe,
            (long)(int)(uVar4 & 0xffff) + (-0xe - (long)(int)((uVar5 & 0xffff) << 1)));
  }
  oswp2(puVar6 + 4,0);
  puVar7 = puVar6 + 0xe;
  uVar3 = osrp2(puVar6 + 4);
  mctx_00 = (mcmcxdef *)(puVar7 + (int)((uVar3 & 0xffff) << 1));
  uVar3 = osrp2(puVar6 + 6);
  for (uVar3 = uVar3 & 0xffff; uVar9 = (undefined2)in_stack_ffffffffffffffd8, uVar3 != 0;
      uVar3 = uVar3 - 1) {
    uVar4 = osrp2(mctx_00);
    in_stack_ffffffffffffffd8 = CONCAT22((short)uVar4,uVar9);
    if ((uVar4 & 0xffff) < (uint)in_DX) {
      in_stack_ffffffffffffff90 = (mcmcxdef *)((long)&mctx_00->mcmcxgl + 6);
      iVar2 = osrp2((void *)((long)&mctx_00->mcmcxgl + 3));
      mctx_00 = (mcmcxdef *)((long)in_stack_ffffffffffffff90->mcmcxmtb + (long)iVar2 + -0x30);
    }
    else {
      *(byte *)((long)&mctx_00->mcmcxgl + 5) = *(byte *)((long)&mctx_00->mcmcxgl + 5) & 0xfd;
      objdelp(mctx_00,(objnum)(uVar3 >> 0x10),(prpnum)uVar3,in_stack_ffffffffffffffd8);
    }
  }
  lVar8 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                      (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar8 + 0x14) = *(ushort *)(lVar8 + 0x14) | 1;
  mcmunlck(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e);
  if ((uVar1 & 2) != 0) {
    objindx(in_stack_00000010,in_stack_0000000e);
  }
  return;
}

Assistant:

void objclr(mcmcxdef *mctx, objnum objn, prpnum mindel)
{
    objdef *o;
    prpdef *p;
    int     cnt;
    prpnum  prop;
    int     indexed;
    
    /* get a lock on the object */
    o = (objdef *)mcmlck(mctx, objn);
    indexed = objflg(o) & OBJFINDEX;
    
    /* delete superclasses - move properties down over former sc array */
    if (objnprop(o))
        memmove(objsc(o), objprp(o),
                (size_t)(((uchar *)o) + objfree(o) - (uchar *)objprp(o)));
    objsnsc(o, 0);                                 /* zero superclasses now */
    
    /* delete non-"system" properties (propnum < mindel) */
    for (p = objprp(o), cnt = objnprop(o) ; cnt ; --cnt)
    {
        if ((prop = prpprop(p)) >= mindel)
        {
            prpflg(p) &= ~PRPFIGN;   /* delete even if it was marked ignore */
            objdelp(mctx, objn, prop, FALSE);  /* remove prpdef from object */
            /* p is left pointing at next prop, as it was moved down */
        }
        else
            p = objpnxt(p);                   /* advance over this property */
    }
    
    /* mark cache object modified and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    if (indexed) objindx(mctx, objn);
}